

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

bool argparse::Argument::is_positional(string_view aName)

{
  string_view s;
  bool bVar1;
  int iVar2;
  char *in_RDX;
  string_view s_00;
  undefined1 auStack_20 [8];
  string_view aName_local;
  
  s_00._M_len = aName._M_str;
  auStack_20 = (undefined1  [8])aName._M_len;
  s_00._M_str = in_RDX;
  aName_local._M_len = (size_t)s_00._M_len;
  iVar2 = lookahead((Argument *)auStack_20,s_00);
  if (iVar2 == -1) {
    aName_local._M_str._7_1_ = true;
  }
  else if (iVar2 == 0x2d) {
    std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20,1);
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
    if (bVar1) {
      aName_local._M_str._7_1_ = true;
    }
    else {
      s._M_str = (char *)aName_local._M_len;
      s._M_len = (size_t)auStack_20;
      aName_local._M_str._7_1_ = is_decimal_literal(s);
    }
  }
  else {
    aName_local._M_str._7_1_ = true;
  }
  return aName_local._M_str._7_1_;
}

Assistant:

static bool is_positional(std::string_view aName) {
    switch (lookahead(aName)) {
    case eof:
      return true;
    case '-': {
      aName.remove_prefix(1);
      if (aName.empty())
        return true;
      else
        return is_decimal_literal(aName);
    }
    default:
      return true;
    }
  }